

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool container_contains_range
                (container_t *c,uint32_t range_start,uint32_t range_end,uint8_t typecode)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint in_EAX;
  ulong uVar5;
  int iVar6;
  undefined7 in_register_00000009;
  uint uVar7;
  ushort uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint in_R9D;
  uint uVar12;
  uint uVar13;
  int iVar14;
  bool bVar15;
  
  uVar13 = (uint)CONCAT71(in_register_00000009,typecode);
  if (uVar13 == 4) {
    uVar13 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  uVar8 = (ushort)range_start;
  if ((char)uVar13 == '\x03') {
    lVar3 = *(long *)((long)c + 8);
    iVar2 = *c;
    iVar6 = iVar2 + -1;
    uVar13 = 0;
    do {
      if (iVar6 < (int)uVar13) {
        uVar12 = ~uVar13;
        break;
      }
      uVar12 = uVar13 + iVar6 >> 1;
      uVar1 = *(ushort *)(lVar3 + (ulong)uVar12 * 4);
      if (uVar1 < uVar8) {
        uVar13 = uVar12 + 1;
        bVar15 = true;
        uVar12 = in_EAX;
      }
      else if (uVar8 < uVar1) {
        iVar6 = uVar12 - 1;
        bVar15 = true;
        uVar12 = in_EAX;
      }
      else {
        bVar15 = false;
      }
      in_EAX = uVar12;
    } while (bVar15);
    if ((-1 < (int)uVar12) ||
       ((uVar12 != 0xffffffff &&
        (uVar12 = -uVar12 - 2,
        range_start - *(ushort *)(lVar3 + (ulong)uVar12 * 4) <=
        (uint)*(ushort *)(lVar3 + 2 + (ulong)uVar12 * 4))))) {
      uVar13 = 0;
      if ((int)uVar12 < iVar2) {
        lVar3 = lVar3 + (long)(int)uVar12 * 4;
        uVar13 = 0;
        lVar10 = 0;
        do {
          uVar8 = *(ushort *)(lVar3 + lVar10 * 4);
          bVar15 = true;
          if (uVar8 < range_end) {
            uVar1 = *(ushort *)(lVar3 + 2 + lVar10 * 4);
            if ((uint)uVar1 + (uint)uVar8 < range_end) {
              uVar7 = ((uint)uVar1 + (uint)uVar8) - range_start;
              if (uVar1 <= uVar7) {
                uVar7 = (uint)uVar1;
              }
              uVar13 = uVar13 + uVar7;
              bVar15 = false;
            }
            else {
              uVar13 = (uVar13 + range_end) - (uint)uVar8;
            }
          }
        } while ((!bVar15) && (iVar6 = (int)lVar10, lVar10 = lVar10 + 1, ~uVar12 + iVar2 != iVar6));
      }
      uVar13 = (uint)(~range_start + range_end <= uVar13);
      goto LAB_00123929;
    }
  }
  else if ((uVar13 & 0xff) == 2) {
    iVar6 = range_end - range_start;
    if (iVar6 == 0 || (int)range_end < (int)range_start) {
      uVar13 = 1;
      goto LAB_00123929;
    }
    iVar2 = *c;
    uVar13 = 0;
    if (iVar2 < iVar6) goto LAB_00123929;
    iVar14 = iVar2 + -1;
    do {
      if (iVar14 < (int)uVar13) {
        uVar12 = ~uVar13;
        break;
      }
      uVar12 = uVar13 + iVar14 >> 1;
      uVar1 = *(ushort *)(*(long *)((long)c + 8) + (ulong)(uVar13 + iVar14 & 0xfffffffe));
      if (uVar1 < uVar8) {
        uVar13 = uVar12 + 1;
        bVar15 = true;
        uVar12 = in_R9D;
      }
      else if (uVar8 < uVar1) {
        iVar14 = uVar12 - 1;
        bVar15 = true;
        uVar12 = in_R9D;
      }
      else {
        bVar15 = false;
      }
      in_R9D = uVar12;
    } while (bVar15);
    if ((-1 < (int)uVar12) && ((int)(uVar12 + iVar6) <= iVar2)) {
      bVar15 = *(short *)(*(long *)((long)c + 8) + -2 + (ulong)(uVar12 + iVar6) * 2) ==
               (short)((short)range_end + -1);
      goto LAB_00123815;
    }
  }
  else {
    uVar9 = (ulong)(range_start >> 6);
    uVar11 = -1L << ((byte)range_start & 0x3f);
    uVar5 = -1L << ((byte)range_end & 0x3f);
    uVar4 = (ulong)(range_end >> 6);
    lVar3 = *(long *)((long)c + 8);
    if (range_start >> 6 == range_end >> 6) {
      bVar15 = (uVar11 & ~(uVar5 | *(ulong *)(lVar3 + uVar4 * 8))) == 0;
LAB_00123815:
      uVar13 = (uint)bVar15;
      goto LAB_00123929;
    }
    if ((uVar11 <= *(ulong *)(lVar3 + uVar9 * 8)) &&
       ((0xffff < range_end || ((uVar5 | *(ulong *)(lVar3 + uVar4 * 8)) == 0xffffffffffffffff)))) {
      do {
        bVar15 = uVar4 <= uVar9 + 1 || 0x3fe < uVar9;
        uVar13 = (uint)bVar15;
        if (bVar15) break;
        uVar13 = 0;
        lVar10 = uVar9 * 8;
        uVar9 = uVar9 + 1;
      } while (*(long *)(lVar3 + 8 + lVar10) == -1);
      goto LAB_00123929;
    }
  }
  uVar13 = 0;
LAB_00123929:
  return SUB41(uVar13,0);
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}